

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgestures.h
# Opt level: O1

void ProcessGestureEvent(GestureEvent event)

{
  double dVar1;
  Vector2 VVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  VVar2 = GESTURES.Touch.downPositionB;
  GESTURES.Touch.pointCount = in_stack_0000000c;
  fVar4 = event.pointId[2];
  fVar6 = event.pointId[3];
  if (in_stack_0000000c != 2) {
    if (in_stack_0000000c != 1) {
      return;
    }
    if (in_stack_00000008 == 0) {
      if ((GESTURES.current == 8) || (GESTURES.current == 4)) {
        GESTURES.Touch.upPosition.x = (float)event.pointId[2];
        GESTURES.Touch.upPosition.y = (float)event.pointId[3];
      }
      fVar4 = GESTURES.Touch.upPosition.x - GESTURES.Touch.downPositionA.x;
      fVar6 = GESTURES.Touch.upPosition.y - GESTURES.Touch.downPositionA.y;
      fVar4 = fVar4 * fVar4 + fVar6 * fVar6;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      GESTURES.Drag.distance = fVar4;
      dVar1 = glfwGetTime();
      GESTURES.Drag.intensity = fVar4 / (float)(dVar1 - GESTURES.Swipe.startTime);
      if ((GESTURES.Drag.intensity <= 0.2) || (GESTURES.current == 8)) {
        GESTURES.Drag.intensity = 0.0;
        GESTURES.Drag.angle = 0.0;
        GESTURES.Drag.distance = 0.0;
        GESTURES.current = 0;
      }
      else {
        fVar4 = atan2f(GESTURES.Touch.upPosition.y - GESTURES.Touch.downPositionA.y,
                       GESTURES.Touch.upPosition.x - GESTURES.Touch.downPositionA.x);
        fVar4 = fVar4 * 57.295776;
        GESTURES.Drag.angle =
             360.0 - (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
                            (uint)(fVar4 + 360.0) & -(uint)(fVar4 < 0.0));
        GESTURES.current = 0x10;
        if ((((30.0 <= GESTURES.Drag.angle) && (GESTURES.Drag.angle <= 330.0)) &&
            ((GESTURES.Drag.angle < 30.0 || (GESTURES.current = 0x40, 150.0 < GESTURES.Drag.angle)))
            ) && ((GESTURES.Drag.angle <= 150.0 ||
                  (GESTURES.current = 0x20, 210.0 <= GESTURES.Drag.angle)))) {
          GESTURES.current =
               (-(uint)(GESTURES.Drag.angle <= 330.0 && 210.0 <= GESTURES.Drag.angle) & 1) << 7;
        }
      }
      GESTURES.Touch.pointCount = 0;
      GESTURES.Touch.downDragPosition.x = 0.0;
      GESTURES.Touch.downDragPosition.y = 0.0;
      return;
    }
    if (in_stack_00000008 == 2) {
      GESTURES.Touch.moveDownPositionA.x = (float)event.pointId[2];
      GESTURES.Touch.moveDownPositionA.y = (float)event.pointId[3];
      if (GESTURES.current == 4) {
        if (GESTURES.Hold.resetRequired) {
          GESTURES.Touch.downPositionA.x = (float)event.pointId[2];
          GESTURES.Touch.downPositionA.y = (float)event.pointId[3];
        }
        GESTURES.Hold.resetRequired = false;
        dVar1 = glfwGetTime();
        if (0.30000001192092896 < dVar1 - GESTURES.Touch.eventTime) {
          GESTURES.Touch.eventTime = glfwGetTime();
          GESTURES.current = 8;
        }
      }
      GESTURES.Drag.vector.y =
           GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
      GESTURES.Drag.vector.x =
           GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
      return;
    }
    if (in_stack_00000008 != 1) {
      return;
    }
    if ((0 < GESTURES.Touch.tapCounter && GESTURES.current == 0) &&
       (GESTURES.Touch.tapCounter = GESTURES.Touch.tapCounter + 1, dVar1 = glfwGetTime(),
       dVar1 - GESTURES.Touch.eventTime < 0.30000001192092896)) {
      fVar4 = fVar4 - GESTURES.Touch.downPositionA.x;
      fVar6 = fVar6 - GESTURES.Touch.downPositionA.y;
      fVar4 = fVar4 * fVar4 + fVar6 * fVar6;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      if (fVar4 < 0.03) {
        GESTURES.current = 2;
        GESTURES.Touch.tapCounter = 0;
        goto LAB_001697b0;
      }
    }
    GESTURES.Touch.tapCounter = 1;
    GESTURES.current = 1;
LAB_001697b0:
    GESTURES.Touch.downPositionA.x = (float)event.pointId[2];
    GESTURES.Touch.downPositionA.y = (float)event.pointId[3];
    GESTURES.Touch.downDragPosition.x = (float)event.pointId[2];
    GESTURES.Touch.downDragPosition.y = (float)event.pointId[3];
    GESTURES.Touch.upPosition.x = (float)event.pointId[2];
    GESTURES.Touch.upPosition.y = (float)event.pointId[3];
    GESTURES.Touch.eventTime = glfwGetTime();
    GESTURES.Swipe.startTime = glfwGetTime();
    GESTURES.Drag.vector.x = 0.0;
    GESTURES.Drag.vector.y = 0.0;
    return;
  }
  if (in_stack_00000008 == 0) {
    GESTURES.current = 0;
    GESTURES.Touch.pointCount = 0;
    GESTURES.Pinch = (anon_struct_16_3_87c46a66_for_Pinch)ZEXT816(0);
    return;
  }
  GESTURES.Touch.downPositionB.x = event.pointId[4];
  fVar8 = GESTURES.Touch.downPositionB.x;
  GESTURES.Touch.downPositionB.y = event.pointId[5];
  fVar3 = GESTURES.Touch.downPositionB.y;
  if (in_stack_00000008 != 2) {
    if (in_stack_00000008 != 1) {
      GESTURES.Touch.downPositionB = VVar2;
      return;
    }
    GESTURES.Touch.downPositionA.x = (float)event.pointId[2];
    GESTURES.Touch.downPositionA.y = (float)event.pointId[3];
    GESTURES.Touch.downPositionB.x = (float)event.pointId[4];
    GESTURES.Touch.downPositionB.y = (float)event.pointId[5];
    GESTURES.Touch.previousPositionA.x = (float)event.pointId[2];
    GESTURES.Touch.previousPositionA.y = (float)event.pointId[3];
    GESTURES.Touch.previousPositionB.x = (float)event.pointId[4];
    GESTURES.Touch.previousPositionB.y = (float)event.pointId[5];
    GESTURES.Pinch.vector.y = fVar3 - fVar6;
    GESTURES.Pinch.vector.x = fVar8 - fVar4;
    GESTURES.current = 4;
    GESTURES.Hold.timeDuration = glfwGetTime();
    return;
  }
  fVar5 = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
  fVar7 = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;
  fVar5 = fVar5 * fVar5 + fVar7 * fVar7;
  GESTURES.Touch.downPositionB = VVar2;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  GESTURES.Pinch.distance = fVar5;
  GESTURES.Touch.moveDownPositionA.x = (float)event.pointId[2];
  GESTURES.Touch.moveDownPositionA.y = (float)event.pointId[3];
  GESTURES.Touch.moveDownPositionB.x = (float)event.pointId[4];
  GESTURES.Touch.moveDownPositionB.y = (float)event.pointId[5];
  GESTURES.Pinch.vector.y = fVar3 - fVar6;
  GESTURES.Pinch.vector.x = fVar8 - fVar4;
  fVar4 = fVar4 - GESTURES.Touch.previousPositionA.x;
  fVar6 = fVar6 - GESTURES.Touch.previousPositionA.y;
  fVar4 = fVar4 * fVar4 + fVar6 * fVar6;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  if (fVar4 < 0.005) {
    fVar4 = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.previousPositionB.x;
    fVar6 = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.previousPositionB.y;
    fVar4 = fVar4 * fVar4 + fVar6 * fVar6;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    if (fVar4 < 0.005) {
      GESTURES.current = 4;
      GESTURES.Hold.timeDuration = glfwGetTime();
      goto LAB_0016971f;
    }
  }
  fVar4 = GESTURES.Touch.previousPositionB.x - GESTURES.Touch.previousPositionA.x;
  fVar6 = GESTURES.Touch.previousPositionB.y - GESTURES.Touch.previousPositionA.y;
  fVar4 = fVar4 * fVar4 + fVar6 * fVar6;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar6 = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
  fVar8 = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;
  fVar6 = fVar6 * fVar6 + fVar8 * fVar8;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  if (fVar4 <= fVar6) {
    GESTURES.current = 0x200;
  }
  else {
    GESTURES.current = 0x100;
  }
LAB_0016971f:
  fVar4 = atan2f(GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y,
                 GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x);
  fVar4 = fVar4 * 57.295776;
  GESTURES.Pinch.angle =
       360.0 - (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
                      (uint)(fVar4 + 360.0) & -(uint)(fVar4 < 0.0));
  return;
}

Assistant:

void ProcessGestureEvent(GestureEvent event)
{
    // Reset required variables
    GESTURES.Touch.pointCount = event.pointCount;      // Required on UpdateGestures()

    if (GESTURES.Touch.pointCount == 1)     // One touch point
    {
        if (event.touchAction == TOUCH_ACTION_DOWN)
        {
            GESTURES.Touch.tapCounter++;    // Tap counter

            // Detect GESTURE_DOUBLE_TAP
            if ((GESTURES.current == GESTURE_NONE) && (GESTURES.Touch.tapCounter >= 2) && ((rgGetCurrentTime() - GESTURES.Touch.eventTime) < TAP_TIMEOUT) && (rgVector2Distance(GESTURES.Touch.downPositionA, event.position[0]) < DOUBLETAP_RANGE))
            {
                GESTURES.current = GESTURE_DOUBLETAP;
                GESTURES.Touch.tapCounter = 0;
            }
            else    // Detect GESTURE_TAP
            {
                GESTURES.Touch.tapCounter = 1;
                GESTURES.current = GESTURE_TAP;
            }

            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downDragPosition = event.position[0];

            GESTURES.Touch.upPosition = GESTURES.Touch.downPositionA;
            GESTURES.Touch.eventTime = rgGetCurrentTime();

            GESTURES.Swipe.startTime = rgGetCurrentTime();

            GESTURES.Drag.vector = (Vector2){ 0.0f, 0.0f };
        }
        else if (event.touchAction == TOUCH_ACTION_UP)
        {
            // A swipe can happen while the current gesture is drag, but (specially for web) also hold, so set upPosition for both cases
            if (GESTURES.current == GESTURE_DRAG || GESTURES.current == GESTURE_HOLD) GESTURES.Touch.upPosition = event.position[0];

            // NOTE: GESTURES.Drag.intensity dependent on the resolution of the screen
            GESTURES.Drag.distance = rgVector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);
            GESTURES.Drag.intensity = GESTURES.Drag.distance/(float)((rgGetCurrentTime() - GESTURES.Swipe.startTime));

            // Detect GESTURE_SWIPE
            if ((GESTURES.Drag.intensity > FORCE_TO_SWIPE) && (GESTURES.current != GESTURE_DRAG))
            {
                // NOTE: Angle should be inverted in Y
                GESTURES.Drag.angle = 360.0f - rgVector2Angle(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);

                if ((GESTURES.Drag.angle < 30) || (GESTURES.Drag.angle > 330)) GESTURES.current = GESTURE_SWIPE_RIGHT;          // Right
                else if ((GESTURES.Drag.angle >= 30) && (GESTURES.Drag.angle <= 150)) GESTURES.current = GESTURE_SWIPE_UP;      // Up
                else if ((GESTURES.Drag.angle > 150) && (GESTURES.Drag.angle < 210)) GESTURES.current = GESTURE_SWIPE_LEFT;     // Left
                else if ((GESTURES.Drag.angle >= 210) && (GESTURES.Drag.angle <= 330)) GESTURES.current = GESTURE_SWIPE_DOWN;   // Down
                else GESTURES.current = GESTURE_NONE;
            }
            else
            {
                GESTURES.Drag.distance = 0.0f;
                GESTURES.Drag.intensity = 0.0f;
                GESTURES.Drag.angle = 0.0f;

                GESTURES.current = GESTURE_NONE;
            }

            GESTURES.Touch.downDragPosition = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;
        }
        else if (event.touchAction == TOUCH_ACTION_MOVE)
        {
            GESTURES.Touch.moveDownPositionA = event.position[0];

            if (GESTURES.current == GESTURE_HOLD)
            {
                if (GESTURES.Hold.resetRequired) GESTURES.Touch.downPositionA = event.position[0];

                GESTURES.Hold.resetRequired = false;

                // Detect GESTURE_DRAG
                if ((rgGetCurrentTime() - GESTURES.Touch.eventTime) > DRAG_TIMEOUT)
                {
                    GESTURES.Touch.eventTime = rgGetCurrentTime();
                    GESTURES.current = GESTURE_DRAG;
                }
            }

            GESTURES.Drag.vector.x = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
            GESTURES.Drag.vector.y = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
        }
    }
    else if (GESTURES.Touch.pointCount == 2)    // Two touch points
    {
        if (event.touchAction == TOUCH_ACTION_DOWN)
        {
            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downPositionB = event.position[1];

            GESTURES.Touch.previousPositionA = GESTURES.Touch.downPositionA;
            GESTURES.Touch.previousPositionB = GESTURES.Touch.downPositionB;

            //GESTURES.Pinch.distance = rgVector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.downPositionB);

            GESTURES.Pinch.vector.x = GESTURES.Touch.downPositionB.x - GESTURES.Touch.downPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.downPositionB.y - GESTURES.Touch.downPositionA.y;

            GESTURES.current = GESTURE_HOLD;
            GESTURES.Hold.timeDuration = rgGetCurrentTime();
        }
        else if (event.touchAction == TOUCH_ACTION_MOVE)
        {
            GESTURES.Pinch.distance = rgVector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);

            GESTURES.Touch.moveDownPositionA = event.position[0];
            GESTURES.Touch.moveDownPositionB = event.position[1];

            GESTURES.Pinch.vector.x = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;

            if ((rgVector2Distance(GESTURES.Touch.previousPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_PINCH) || (rgVector2Distance(GESTURES.Touch.previousPositionB, GESTURES.Touch.moveDownPositionB) >= MINIMUM_PINCH))
            {
                if ( rgVector2Distance(GESTURES.Touch.previousPositionA, GESTURES.Touch.previousPositionB) > rgVector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB) ) GESTURES.current = GESTURE_PINCH_IN;
                else GESTURES.current = GESTURE_PINCH_OUT;
            }
            else
            {
                GESTURES.current = GESTURE_HOLD;
                GESTURES.Hold.timeDuration = rgGetCurrentTime();
            }

            // NOTE: Angle should be inverted in Y
            GESTURES.Pinch.angle = 360.0f - rgVector2Angle(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);
        }
        else if (event.touchAction == TOUCH_ACTION_UP)
        {
            GESTURES.Pinch.distance = 0.0f;
            GESTURES.Pinch.angle = 0.0f;
            GESTURES.Pinch.vector = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;

            GESTURES.current = GESTURE_NONE;
        }
    }
    else if (GESTURES.Touch.pointCount > 2)     // More than two touch points
    {
        // TODO: Process gesture events for more than two points
    }
}